

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O1

int dasm_encode(BuildCtx *ctx,void *buffer)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  dasm_State *pdVar4;
  int *piVar5;
  int *piVar6;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  long lVar11;
  char cVar12;
  ulong __n;
  uchar *mm;
  byte *pbVar13;
  byte bVar14;
  uint *puVar15;
  byte *pbVar16;
  int iVar17;
  byte *__s;
  
  pdVar4 = ctx->D;
  __s = (byte *)buffer;
  if (0 < pdVar4->maxsection) {
    lVar11 = 0;
    do {
      puVar15 = (uint *)pdVar4->sections[lVar11].buf;
      iVar2 = pdVar4->sections[lVar11].pos;
      piVar5 = pdVar4->sections[lVar11].rbuf;
      while (puVar15 != (uint *)(piVar5 + iVar2)) {
        uVar8 = *puVar15;
        puVar15 = puVar15 + 1;
        pbVar10 = (byte *)0x0;
        pbVar13 = pdVar4->actionlist + (int)uVar8;
        do {
          bVar14 = *pbVar13;
          __n = 0;
          if ((byte)(bVar14 + 0x17) < 0x12) {
            __n = (ulong)*puVar15;
            puVar15 = puVar15 + 1;
          }
          uVar8 = (uint)__n;
          pbVar16 = pbVar13 + 1;
          if (0x16 < bVar14 - 0xe9) {
LAB_0010664d:
            *__s = bVar14;
            __s = __s + 1;
            goto switchD_00106381_caseD_f2;
          }
          cVar12 = (char)__n;
          iVar17 = (int)__s;
          switch((uint)bVar14) {
          case 0xe9:
            pbVar13 = pbVar10;
            if (pbVar10 == (byte *)0x0) {
              pbVar13 = __s;
            }
            pbVar10 = (byte *)0x0;
            if ((*pbVar16 & 0xfe) == 0xee) {
              pbVar10 = pbVar13;
            }
            if (uVar8 == 0) {
              bVar14 = pbVar13[-1] & 7;
              if (bVar14 == 4) {
                bVar14 = *pbVar13 & 7;
              }
              if (bVar14 == 5) goto LAB_0010646d;
              pbVar13[-1] = pbVar13[-1] + 0x80;
              iVar17 = 9;
            }
            else {
LAB_0010646d:
              iVar17 = 10;
              if ((int)cVar12 == uVar8) {
                pbVar13[-1] = pbVar13[-1] - 0x40;
                iVar17 = 0;
              }
            }
            if (iVar17 == 10) goto switchD_00106381_caseD_ed;
            if (iVar17 == 9) break;
            if (iVar17 == 0) goto LAB_0010677f;
            goto LAB_001067f7;
          default:
switchD_00106381_caseD_ea:
            goto LAB_0010677f;
          case 0xec:
switchD_00106381_caseD_ec:
            *(short *)__s = (short)__n;
            __s = __s + 2;
            break;
          case 0xed:
            goto switchD_00106381_caseD_ed;
          case 0xee:
            if ((int)cVar12 != uVar8) {
              pbVar10 = (byte *)0x0;
              goto switchD_00106381_caseD_ec;
            }
LAB_001065ef:
            if (pbVar10 == (byte *)0x0) {
              pbVar10 = __s;
            }
            pbVar10[-2] = pbVar10[-2] + 2;
            pbVar10 = (byte *)0x0;
LAB_0010677f:
            *__s = (byte)__n;
            __s = __s + 1;
            break;
          case 0xef:
            if ((int)cVar12 == uVar8) goto LAB_001065ef;
            pbVar10 = (byte *)0x0;
            goto switchD_00106381_caseD_ed;
          case 0xf0:
            bVar14 = pbVar13[1];
            pbVar16 = __s + -(ulong)(bVar14 & 7);
            if (((__n & 8) == 0) || (0x9f < bVar14)) {
              if ((__n & 0x10) != 0) {
                if ((char)*pbVar16 < '\0') {
                  *pbVar16 = 0xc5;
                  pbVar16[1] = pbVar16[1] & 0x80 | pbVar16[2];
                  pbVar16 = pbVar16 + 2;
                }
                if (pbVar16 + 1 < __s) {
                  memmove(pbVar16,pbVar16 + 1,(size_t)(__s + ~(ulong)pbVar16));
                }
                if (pbVar10 != (byte *)0x0) {
                  pbVar10 = pbVar10 + -1;
                }
                __s = __s + -1;
                goto LAB_001067ab;
              }
            }
            else {
              if ((char)*pbVar16 < '\0') {
                pbVar16[1] = pbVar16[1] ^ ' ' << (bVar14 >> 6);
              }
              else {
                *pbVar16 = *pbVar16 ^ '\x01' << (bVar14 >> 6);
              }
LAB_001067ab:
              __n = (ulong)(uVar8 & 7);
            }
            iVar17 = (int)__n;
            if (bVar14 < 0xc0) {
              if (bVar14 < 0x40) {
                if ((iVar17 == 4) && (bVar14 < 0x20)) {
                  __s[-1] = __s[-1] ^ 4;
                  *__s = 0x20;
                  __s = __s + 1;
                  __n = 4;
                }
              }
              else {
                __n = (ulong)(uint)(iVar17 << 3);
              }
            }
            else {
              __n = (ulong)(uint)(iVar17 << 4);
            }
            __s[-1] = __s[-1] ^ (byte)__n;
            goto LAB_001067ef;
          case 0xf1:
            if (uVar8 != 0) {
              memset(__s,(uint)*pbVar16,__n);
              __s = __s + (ulong)(uVar8 - 1) + 1;
            }
            goto LAB_001067ef;
          case 0xf2:
          case 0xf9:
            break;
          case 0xf3:
switchD_00106381_caseD_f3:
            goto LAB_0010678d;
          case 0xf4:
            pbVar16 = pbVar13 + 2;
            if (-1 < (int)uVar8) goto switchD_00106381_caseD_f5;
            puVar15 = puVar15 + 1;
            uVar8 = *(uint *)(pdVar4->globals + (int)(-10 - uVar8));
LAB_0010678d:
            __n = (ulong)((uVar8 - (int)__s) - 4);
            goto switchD_00106381_caseD_ed;
          case 0xf5:
switchD_00106381_caseD_f5:
            piVar6 = pdVar4->sections[(int)uVar8 >> 0x18].rbuf;
            iVar3 = piVar6[(int)uVar8];
            if (iVar3 < 0) {
              __n = (ulong)(uint)piVar6[(long)(int)uVar8 + 1];
              iVar17 = 0x18;
            }
            else {
              uVar8 = *puVar15;
              __n = (ulong)((uVar8 + ((int)buffer - iVar17) + iVar3) - 4);
              if (uVar8 == 0) {
                iVar17 = 10;
              }
              else {
                if (uVar8 == 4) {
                  __s[-2] = __s[-1] - 0x10;
                  __s = __s + -1;
                }
                else {
                  __s[-1] = 0xeb;
                }
                iVar17 = 0xb;
              }
            }
            uVar8 = (uint)__n;
            puVar15 = puVar15 + 1;
            if (iVar17 != 10) {
              if (iVar17 != 0xb) goto switchD_00106381_caseD_f3;
              goto switchD_00106381_caseD_ea;
            }
            goto switchD_00106381_caseD_ed;
          case 0xf6:
            pbVar16 = pbVar13 + 2;
            if (-1 < (int)uVar8) goto switchD_00106381_caseD_f7;
            *(void **)__s = pdVar4->globals[(int)(-10 - uVar8)];
            __s = __s + 8;
            goto LAB_001067ef;
          case 0xf7:
switchD_00106381_caseD_f7:
            piVar6 = pdVar4->sections[(int)uVar8 >> 0x18].rbuf;
            lVar9 = (long)piVar6[(int)uVar8];
            if (lVar9 < 0) {
              lVar9 = (long)piVar6[(long)(int)uVar8 + 1];
            }
            else {
              lVar9 = lVar9 + (long)buffer;
            }
            *(long *)__s = lVar9;
            __s = __s + 8;
            break;
          case 0xf8:
            if (9 < pbVar13[1]) {
              if (pbVar13[2] == 0xf2) {
                __n = (ulong)*puVar15;
              }
              pdVar4->globals[pbVar13[1] - 10] = (void *)((long)(int)__n + (long)buffer);
            }
            goto LAB_001067ef;
          case 0xfa:
            bVar14 = pbVar13[1];
            if ((iVar17 - (int)buffer & (uint)bVar14) != 0) {
              pbVar16 = __s + (1 - (long)buffer);
              do {
                *__s = 0x90;
                __s = __s + 1;
                uVar8 = (uint)pbVar16;
                pbVar16 = pbVar16 + 1;
              } while ((uVar8 & bVar14) != 0);
            }
LAB_001067ef:
            pbVar16 = pbVar13 + 2;
            break;
          case 0xfb:
            if (199 < ctx->nreloc) {
              dasm_encode_cold_1();
            }
            bVar14 = *pbVar16;
            bVar1 = pbVar13[2];
            if (relocmap[bVar1] < 0) {
              relocmap[bVar1] = ctx->nrelocsym;
              pcVar7 = sym_decorate(ctx,"",extnames[bVar1]);
              iVar3 = ctx->nrelocsym;
              ctx->relocsym[iVar3] = pcVar7;
              ctx->nrelocsym = iVar3 + 1;
            }
            iVar3 = ctx->nreloc;
            ctx->reloc[iVar3].ofs = iVar17 - *(int *)&ctx->code;
            ctx->reloc[iVar3].sym = relocmap[bVar1];
            ctx->reloc[iVar3].type = (uint)bVar14;
            ctx->nreloc = iVar3 + 1;
            pbVar16 = pbVar13 + 3;
            __n = 0;
switchD_00106381_caseD_ed:
            *(int *)__s = (int)__n;
            __s = __s + 4;
            break;
          case 0xfc:
            bVar14 = pbVar13[1];
            pbVar16 = pbVar13 + 2;
            goto LAB_0010664d;
          case 0xfd:
            pbVar10 = __s;
            break;
          case 0xfe:
          case 0xff:
            iVar17 = 0x1d;
            goto LAB_001067f7;
          }
switchD_00106381_caseD_f2:
          iVar17 = 0;
LAB_001067f7:
          pbVar13 = pbVar16;
        } while (iVar17 == 0);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pdVar4->maxsection);
  }
  return (uint)((byte *)((long)buffer + pdVar4->codesize) != __s) << 0x19;
}

Assistant:

int dasm_encode(Dst_DECL, void *buffer)
{
  dasm_State *D = Dst_REF;
  unsigned char *base = (unsigned char *)buffer;
  unsigned char *cp = base;
  int secnum;

  /* Encode all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->buf;
    int *endb = sec->rbuf + sec->pos;

    while (b != endb) {
      dasm_ActList p = D->actionlist + *b++;
      unsigned char *mark = NULL;
      while (1) {
	int action = *p++;
	int n = (action >= DASM_DISP && action <= DASM_ALIGN) ? *b++ : 0;
	switch (action) {
	case DASM_DISP: if (!mark) mark = cp; {
	  unsigned char *mm = mark;
	  if (*p != DASM_IMM_DB && *p != DASM_IMM_WB) mark = NULL;
	  if (n == 0) { int mrm = mm[-1]&7; if (mrm == 4) mrm = mm[0]&7;
	    if (mrm != 5) { mm[-1] -= 0x80; break; } }
	  if (((n+128) & -256) != 0) goto wd; else mm[-1] -= 0x40;
	}
	  /* fallthrough */
	case DASM_IMM_S: case DASM_IMM_B: wb: dasmb(n); break;
	case DASM_IMM_DB: if (((n+128)&-256) == 0) {
	    db: if (!mark) mark = cp; mark[-2] += 2; mark = NULL; goto wb;
	  } else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_D: wd: dasmd(n); break;
	case DASM_IMM_WB: if (((n+128)&-256) == 0) goto db; else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_W: dasmw(n); break;
	case DASM_VREG: {
	  int t = *p++;
	  unsigned char *ex = cp - (t&7);
	  if ((n & 8) && t < 0xa0) {
	    if (*ex & 0x80) ex[1] ^= 0x20 << (t>>6); else *ex ^= 1 << (t>>6);
	    n &= 7;
	  } else if (n & 0x10) {
	    if (*ex & 0x80) {
	      *ex = 0xc5; ex[1] = (ex[1] & 0x80) | ex[2]; ex += 2;
	    }
	    while (++ex < cp) ex[-1] = *ex;
	    if (mark) mark--;
	    cp--;
	    n &= 7;
	  }
	  if (t >= 0xc0) n <<= 4;
	  else if (t >= 0x40) n <<= 3;
	  else if (n == 4 && t < 0x20) { cp[-1] ^= n; *cp++ = 0x20; }
	  cp[-1] ^= n;
	  break;
	}
	case DASM_REL_LG: p++; if (n >= 0) goto rel_pc;
	  b++; n = (int)(ptrdiff_t)D->globals[-n-10];
	  /* fallthrough */
	case DASM_REL_A: rel_a:
	  n -= (unsigned int)(ptrdiff_t)(cp+4); goto wd; /* !x64 */
	case DASM_REL_PC: rel_pc: {
	  int shrink = *b++;
	  int *pb = DASM_POS2PTR(D, n); if (*pb < 0) { n = pb[1]; goto rel_a; }
	  n = *pb - ((int)(cp-base) + 4-shrink);
	  if (shrink == 0) goto wd;
	  if (shrink == 4) { cp--; cp[-1] = *cp-0x10; } else cp[-1] = 0xeb;
	  goto wb;
	}
	case DASM_IMM_LG:
	  p++;
	  if (n < 0) { dasma((ptrdiff_t)D->globals[-n-10]); break; }
	  /* fallthrough */
	case DASM_IMM_PC: {
	  int *pb = DASM_POS2PTR(D, n);
	  dasma(*pb < 0 ? (ptrdiff_t)pb[1] : (*pb + (ptrdiff_t)base));
	  break;
	}
	case DASM_LABEL_LG: {
	  int idx = *p++;
	  if (idx >= 10)
	    D->globals[idx-10] = (void *)(base + (*p == DASM_SETLABEL ? *b : n));
	  break;
	}
	case DASM_LABEL_PC: case DASM_SETLABEL: break;
	case DASM_SPACE: { int fill = *p++; while (n--) *cp++ = fill; break; }
	case DASM_ALIGN:
	  n = *p++;
	  while (((cp-base) & n)) *cp++ = 0x90; /* nop */
	  break;
	case DASM_EXTERN: n = DASM_EXTERN(Dst, cp, p[1], *p); p += 2; goto wd;
	case DASM_MARK: mark = cp; break;
	case DASM_ESC: action = *p++;
	  /* fallthrough */
	default: *cp++ = action; break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	}
      }
      stop: (void)0;
    }
  }

  if (base + D->codesize != cp)  /* Check for phase errors. */
    return DASM_S_PHASE;
  return DASM_S_OK;
}